

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O3

int __thiscall SPSUnit::deserializeVuiParameters(SPSUnit *this)

{
  BitStreamReader *this_00;
  uint *puVar1;
  uint *puVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined8 *puVar7;
  uint uVar8;
  int local_38;
  
  this_00 = &(this->super_NALUnit).bitReader;
  bVar3 = BitStreamReader::getBit(this_00);
  this->aspect_ratio_info_present_flag = (uint)bVar3;
  if (bVar3) {
    uVar4 = BitStreamReader::getBits(this_00,8);
    this->aspect_ratio_idc = (uint8_t)uVar4;
    if ((uint8_t)uVar4 == 0xff) {
      uVar4 = BitStreamReader::getBits(this_00,0x10);
      this->sar_width = (uint16_t)uVar4;
      uVar4 = BitStreamReader::getBits(this_00,0x10);
      this->sar_height = (uint16_t)uVar4;
    }
  }
  bVar3 = BitStreamReader::getBit(this_00);
  if (bVar3) {
    BitStreamReader::skipBit(this_00);
  }
  bVar3 = BitStreamReader::getBit(this_00);
  if (bVar3) {
    BitStreamReader::skipBits(this_00,4);
    bVar3 = BitStreamReader::getBit(this_00);
    if (bVar3) {
      BitStreamReader::skipBits(this_00,0x18);
    }
  }
  bVar3 = BitStreamReader::getBit(this_00);
  if (bVar3) {
    uVar4 = 0xffffffff;
    do {
      bVar3 = BitStreamReader::getBit(this_00);
      uVar4 = uVar4 + 1;
    } while (!bVar3);
    if (0x20 < uVar4) goto LAB_001c1b02;
    uVar8 = 0xffffffff;
    uVar5 = BitStreamReader::getBits(this_00,uVar4);
    if ((-1 << ((byte)uVar4 & 0x1f)) - uVar5 < 0xfffffffa) {
      return 1;
    }
    do {
      bVar3 = BitStreamReader::getBit(this_00);
      uVar8 = uVar8 + 1;
    } while (!bVar3);
    if (0x20 < uVar8) goto LAB_001c1b02;
    uVar4 = BitStreamReader::getBits(this_00,uVar8);
    if ((-1 << ((byte)uVar8 & 0x1f)) - uVar4 < 0xfffffffa) {
      return 1;
    }
  }
  bVar3 = BitStreamReader::getBit(this_00);
  this->timing_info_present_flag = (uint)bVar3;
  if (bVar3) {
    this->num_units_in_tick_bit_pos =
         ((*(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_buffer -
          *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_initBuffer) * 8 -
         (this->super_NALUnit).bitReader.m_bitLeft) + 0x20;
    uVar4 = BitStreamReader::getBits(this_00,0x20);
    this->num_units_in_tick = uVar4;
    uVar4 = BitStreamReader::getBits(this_00,0x20);
    this->time_scale = uVar4;
    bVar3 = BitStreamReader::getBit(this_00);
    this->fixed_frame_rate_flag = (uint)bVar3;
  }
  this->hrdParamsBitPos =
       ((*(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_buffer -
        *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_initBuffer) * 8 -
       (this->super_NALUnit).bitReader.m_bitLeft) + 0x40;
  bVar3 = BitStreamReader::getBit(this_00);
  (this->nalHrdParams).isPresent = bVar3;
  if (bVar3) {
    puVar1 = (this->super_NALUnit).bitReader.super_BitStream.m_buffer;
    puVar2 = (this->super_NALUnit).bitReader.super_BitStream.m_initBuffer;
    uVar4 = (this->super_NALUnit).bitReader.m_bitLeft;
    iVar6 = hrd_parameters(this,&this->nalHrdParams);
    if (iVar6 != 0) {
      return 1;
    }
    (this->nalHrdParams).bitLen =
         ((uVar4 + ((int)puVar2 - (int)puVar1) * 8) - (this->super_NALUnit).bitReader.m_bitLeft) +
         (*(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_buffer -
         *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_initBuffer) * 8;
  }
  bVar3 = BitStreamReader::getBit(this_00);
  (this->vclHrdParams).isPresent = bVar3;
  if (bVar3) {
    puVar1 = (this->super_NALUnit).bitReader.super_BitStream.m_buffer;
    puVar2 = (this->super_NALUnit).bitReader.super_BitStream.m_initBuffer;
    uVar4 = (this->super_NALUnit).bitReader.m_bitLeft;
    iVar6 = hrd_parameters(this,&this->vclHrdParams);
    if (iVar6 != 0) {
      return 1;
    }
    local_38 = (int)puVar1;
    (this->vclHrdParams).bitLen =
         ((uVar4 + ((int)puVar2 - local_38) * 8) - (this->super_NALUnit).bitReader.m_bitLeft) +
         (*(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_buffer -
         *(int *)&(this->super_NALUnit).bitReader.super_BitStream.m_initBuffer) * 8;
  }
  if (((this->nalHrdParams).isPresent != false) || ((this->vclHrdParams).isPresent == true)) {
    bVar3 = BitStreamReader::getBit(this_00);
    this->low_delay_hrd_flag = (uint)bVar3;
  }
  bVar3 = BitStreamReader::getBit(this_00);
  this->pic_struct_present_flag = (uint)bVar3;
  bVar3 = BitStreamReader::getBit(this_00);
  if (!bVar3) {
    return 0;
  }
  BitStreamReader::skipBit(this_00);
  uVar4 = 0xffffffff;
  do {
    bVar3 = BitStreamReader::getBit(this_00);
    uVar4 = uVar4 + 1;
  } while (!bVar3);
  if (uVar4 < 0x21) {
    uVar8 = 0xffffffff;
    uVar5 = BitStreamReader::getBits(this_00,uVar4);
    if ((-1 << ((byte)uVar4 & 0x1f)) - uVar5 < 0xffffffef) {
      return 1;
    }
    do {
      bVar3 = BitStreamReader::getBit(this_00);
      uVar8 = uVar8 + 1;
    } while (!bVar3);
    if (uVar8 < 0x21) {
      uVar5 = 0xffffffff;
      uVar4 = BitStreamReader::getBits(this_00,uVar8);
      if ((-1 << ((byte)uVar8 & 0x1f)) - uVar4 < 0xffffffef) {
        return 1;
      }
      do {
        bVar3 = BitStreamReader::getBit(this_00);
        uVar5 = uVar5 + 1;
      } while (!bVar3);
      if (uVar5 < 0x21) {
        uVar8 = 0xffffffff;
        uVar4 = BitStreamReader::getBits(this_00,uVar5);
        if ((-1 << ((byte)uVar5 & 0x1f)) - uVar4 < 0xffffffef) {
          return 1;
        }
        do {
          bVar3 = BitStreamReader::getBit(this_00);
          uVar8 = uVar8 + 1;
        } while (!bVar3);
        if (uVar8 < 0x21) {
          uVar4 = BitStreamReader::getBits(this_00,uVar8);
          if ((-1 << ((byte)uVar8 & 0x1f)) - uVar4 < 0xffffffef) {
            return 1;
          }
          uVar4 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
          uVar5 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
          if (uVar4 <= uVar5) {
            return 0;
          }
          return 1;
        }
      }
    }
  }
LAB_001c1b02:
  puVar7 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar7 = &PTR__exception_0023ca88;
  __cxa_throw(puVar7,&BitStreamException::typeinfo,std::exception::~exception);
}

Assistant:

int SPSUnit::deserializeVuiParameters()
{
    aspect_ratio_info_present_flag = bitReader.getBit();
    if (aspect_ratio_info_present_flag)
    {
        aspect_ratio_idc = bitReader.getBits<uint8_t>(8);
        if (aspect_ratio_idc == Extended_SAR)
        {
            sar_width = bitReader.getBits<uint16_t>(16);
            sar_height = bitReader.getBits<uint16_t>(16);
        }
    }
    if (bitReader.getBit())   // overscan_info_present_flag
        bitReader.skipBit();  // overscan_appropriate_flag
    if (bitReader.getBit())   // video_signal_type_present_flag
    {
        bitReader.skipBits(4);       // video_format, video_full_range_flag
        if (bitReader.getBit())      // colour_description_present_flag
            bitReader.skipBits(24);  // colour_primaries, transfer_characteristics, matrix_coefficients
    }
    if (bitReader.getBit())  // chroma_loc_info_present_flag
    {
        if (extractUEGolombCode() > 5)  // chroma_sample_loc_type_top_field
            return 1;
        if (extractUEGolombCode() > 5)  // chroma_sample_loc_type_bottom_field
            return 1;
    }
    timing_info_present_flag = bitReader.getBit();
    if (timing_info_present_flag)
    {
        num_units_in_tick_bit_pos = bitReader.getBitsCount();
        num_units_in_tick = bitReader.getBits(32);
        time_scale = bitReader.getBits(32);
        fixed_frame_rate_flag = bitReader.getBit();
    }
    hrdParamsBitPos = bitReader.getBitsCount() + 32;

    // orig_hrd_parameters_present_flag =
    nalHrdParams.isPresent = bitReader.getBit();
    if (nalHrdParams.isPresent)
    {
        const int beforeCount = bitReader.getBitsCount();
        if (hrd_parameters(nalHrdParams) != 0)
            return 1;
        nalHrdParams.bitLen = bitReader.getBitsCount() - beforeCount;
    }

    vclHrdParams.isPresent = bitReader.getBit();
    if (vclHrdParams.isPresent)
    {
        const int beforeCount = bitReader.getBitsCount();
        if (hrd_parameters(vclHrdParams) != 0)
            return 1;
        vclHrdParams.bitLen = bitReader.getBitsCount() - beforeCount;
    }
    if (nalHrdParams.isPresent || vclHrdParams.isPresent)
        low_delay_hrd_flag = bitReader.getBit();
    pic_struct_present_flag = bitReader.getBit();
    if (bitReader.getBit())  // bitstream_restriction_flag
    {
        bitReader.skipBit();             // motion_vectors_over_pic_boundaries_flag
        if (extractUEGolombCode() > 16)  // max_bytes_per_pic_denom
            return 1;
        if (extractUEGolombCode() > 16)  // max_bits_per_mb_denom
            return 1;
        if (extractUEGolombCode() > 16)  // log2_max_mv_length_horizontal
            return 1;
        if (extractUEGolombCode() > 16)  // log2_max_mv_length_vertical
            return 1;
        if (extractUEGolombCode() > extractUEGolombCode())  // num_reorder_frames > max_dec_frame_buffering
            return 1;
    }
    return 0;
}